

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evpath_dp.c
# Opt level: O0

void EvpathNotifyConnFailure(CP_Services Svcs,DP_RS_Stream Stream_v,int FailedPeerRank)

{
  undefined8 uVar1;
  int in_EDX;
  Evpath_RS_Stream in_RSI;
  CManager in_RDI;
  undefined8 in_R9;
  CManager cm;
  Evpath_RS_Stream Stream;
  Evpath_RS_Stream Stream_00;
  
  Stream_00 = in_RSI;
  uVar1 = (**(code **)(in_RDI + 8))(in_RSI->CP_Stream);
  (**(code **)in_RDI)(in_RSI->CP_Stream,4,
                      "received notification that writer peer %d has failed, failing any pending requests\n"
                      ,in_EDX,*(code **)in_RDI,in_R9,uVar1);
  FailRequestsToRank((CP_Services)cm,in_RDI,Stream_00,in_EDX);
  return;
}

Assistant:

static void EvpathNotifyConnFailure(CP_Services Svcs, DP_RS_Stream Stream_v, int FailedPeerRank)
{
    Evpath_RS_Stream Stream =
        (Evpath_RS_Stream)Stream_v; /* DP_RS_Stream is the return from InitReader */
    CManager cm = Svcs->getCManager(Stream->CP_Stream);
    Svcs->verbose(Stream->CP_Stream, DPPerRankVerbose,
                  "received notification that writer peer "
                  "%d has failed, failing any pending "
                  "requests\n",
                  FailedPeerRank);
    FailRequestsToRank(Svcs, cm, Stream, FailedPeerRank);
}